

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall vmbt_mt_ifc::put_state_buf(vmbt_mt_ifc *this,char *buf)

{
  char *in_RDI;
  CVmMT19937 *unaff_retaddr;
  
  CVmMT19937::put_state(unaff_retaddr,in_RDI);
  return;
}

Assistant:

virtual void put_state_buf(const char *buf) { mt->put_state(buf); }